

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O0

int BN_uadd(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int iVar1;
  int num;
  ulong *ap_00;
  ulong *rp_00;
  ulong uVar2;
  BIGNUM *pBVar3;
  BIGNUM *tmp;
  unsigned_long t2;
  unsigned_long t1;
  unsigned_long carry;
  unsigned_long *rp;
  unsigned_long *bp;
  unsigned_long *ap;
  int dif;
  int min;
  int max;
  BIGNUM *in_stack_ffffffffffffff98;
  BIGNUM *in_stack_ffffffffffffffa0;
  ulong local_50;
  ulong *local_48;
  ulong *local_38;
  int local_2c;
  BIGNUM *local_20;
  BIGNUM *local_18;
  int local_4;
  
  local_20 = b;
  local_18 = a;
  if (a->top < b->top) {
    in_stack_ffffffffffffff98 = a;
    local_20 = a;
    local_18 = b;
  }
  iVar1 = local_18->top;
  num = local_20->top;
  local_2c = iVar1 - num;
  pBVar3 = bn_wexpand(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (pBVar3 == (BIGNUM *)0x0) {
    local_4 = 0;
  }
  else {
    r->top = iVar1;
    ap_00 = local_18->d;
    rp_00 = r->d;
    local_50 = bn_add_words(rp_00,ap_00,local_20->d,num);
    local_48 = rp_00 + num;
    local_38 = ap_00 + num;
    while (local_2c != 0) {
      local_2c = local_2c + -1;
      uVar2 = *local_38;
      *local_48 = uVar2 + local_50;
      local_50 = (long)(int)(uint)(uVar2 + local_50 == 0) & local_50;
      local_48 = local_48 + 1;
      local_38 = local_38 + 1;
    }
    *local_48 = local_50;
    r->top = r->top + (int)local_50;
    r->neg = 0;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int BN_uadd(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max, min, dif;
    const BN_ULONG *ap, *bp;
    BN_ULONG *rp, carry, t1, t2;

    bn_check_top(a);
    bn_check_top(b);

    if (a->top < b->top) {
        const BIGNUM *tmp;

        tmp = a;
        a = b;
        b = tmp;
    }
    max = a->top;
    min = b->top;
    dif = max - min;

    if (bn_wexpand(r, max + 1) == NULL)
        return 0;

    r->top = max;

    ap = a->d;
    bp = b->d;
    rp = r->d;

    carry = bn_add_words(rp, ap, bp, min);
    rp += min;
    ap += min;

    while (dif) {
        dif--;
        t1 = *(ap++);
        t2 = (t1 + carry) & BN_MASK2;
        *(rp++) = t2;
        carry &= (t2 == 0);
    }
    *rp = carry;
    r->top += carry;

    r->neg = 0;
    bn_check_top(r);
    return 1;
}